

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_vec3f ma_atomic_vec3f_get(ma_atomic_vec3f *v)

{
  ma_vec3f mVar1;
  ma_vec3f *in_RDI;
  ma_vec3f r;
  
  ma_spinlock_lock((ma_spinlock *)(in_RDI + 1));
  mVar1 = *in_RDI;
  ma_spinlock_unlock((ma_spinlock *)(in_RDI + 1));
  return mVar1;
}

Assistant:

MA_API ma_vec3f ma_atomic_vec3f_get(ma_atomic_vec3f* v)
{
    ma_vec3f r;

    ma_spinlock_lock(&v->lock);
    {
        r = v->v;
    }
    ma_spinlock_unlock(&v->lock);

    return r;
}